

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replace.c
# Opt level: O1

void multifast_rep_flush(AC_TRIE_t *thiz,int keep)

{
  if (keep == 0) {
    mf_repdata_do_replace(&thiz->repdata,thiz->base_position);
  }
  (*(thiz->repdata).cbf)(&(thiz->repdata).buffer,(thiz->repdata).user);
  (thiz->repdata).buffer.length = 0;
  if (keep == 0) {
    (thiz->repdata).buffer.length = 0;
    (thiz->repdata).backlog.length = 0;
    (thiz->repdata).noms_size = 0;
    (thiz->repdata).curser = 0;
    thiz->last_node = thiz->root;
    thiz->base_position = 0;
  }
  return;
}

Assistant:

void multifast_rep_flush (AC_TRIE_t *thiz, int keep)
{
    if (!keep)
    {
        mf_repdata_do_replace (&thiz->repdata, thiz->base_position);
    }
    
    mf_repdata_flush (&thiz->repdata);
    
    if (!keep)
    {
        mf_repdata_reset (&thiz->repdata);
        thiz->last_node = thiz->root;
        thiz->base_position = 0;
    }
}